

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Sphere *sphere)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  Point PVar5;
  Vector VVar6;
  Vector VVar7;
  float local_48;
  float fStack_44;
  Vector local_30;
  float local_24;
  
  PVar5 = operator-(segment->b,&sphere->center);
  local_30.z = sphere->radius;
  local_30.x = PVar5.x / local_30.z;
  local_30.y = PVar5.y / local_30.z;
  local_30.z = PVar5.z / local_30.z;
  VVar6 = normalize(&local_30);
  local_24 = VVar6.z;
  PVar5 = operator-(segment->b,&segment->a);
  local_30.z = PVar5.z;
  local_30._0_8_ = PVar5._0_8_;
  VVar7 = normalize(&local_30);
  local_48 = VVar6.x;
  fStack_44 = VVar6.y;
  fVar4 = VVar7.z * local_24 + VVar7.x * local_48 + fStack_44 * VVar7.y;
  fVar4 = fVar4 + fVar4;
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar1 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar1;
  uVar2 = (segment->b).x;
  uVar3 = (segment->b).y;
  fVar1 = (segment->b).z;
  (__return_storage_ptr__->b).x = (VVar7.x - local_48 * fVar4) + (float)uVar2;
  (__return_storage_ptr__->b).y = (float)uVar3 + (VVar7.y - fStack_44 * fVar4);
  (__return_storage_ptr__->b).z = (VVar7.z - fVar4 * local_24) + fVar1;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Sphere const& sphere)
{
  Point normalVector = normalize((segment.b - sphere.center) / sphere.radius);

  Vector ri = normalize(segment.b - segment.a);
  float dot = dotProduct(ri, normalVector);
  ri -= normalVector * (2 * dot);

  return {segment.b, segment.b + ri};
}